

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchAI.cpp
# Opt level: O0

void __thiscall
tiger::trains::ai::SwitchAI::SwitchAI
          (SwitchAI *this,World *world,
          vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
          *trainAIList)

{
  TrainAI *this_00;
  bool bVar1;
  reference ppTVar2;
  undefined8 in_RDX;
  _func_int **in_RSI;
  ISubBot *in_RDI;
  TrainAI *bot;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *__range2;
  GoodType in_stack_ffffffffffffff98;
  GoodType in_stack_ffffffffffffff9c;
  __normal_iterator<tiger::trains::ai::TrainAI_*const_*,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
  *__lhs;
  vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *this_01;
  __normal_iterator<tiger::trains::ai::TrainAI_*const_*,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
  local_28;
  undefined8 local_20;
  undefined8 local_18;
  _func_int **local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  ISubBot::ISubBot(in_RDI);
  in_RDI->_vptr_ISubBot = (_func_int **)&PTR__SwitchAI_002d3f18;
  __lhs = (__normal_iterator<tiger::trains::ai::TrainAI_*const_*,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
           *)(in_RDI + 2);
  std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::vector
            ((vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *)
             0x249e43);
  this_01 = (vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *)
            (in_RDI + 5);
  std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::vector
            ((vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *)
             0x249e56);
  local_20 = local_18;
  local_28._M_current =
       (TrainAI **)
       std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
       begin((vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::end
            ((vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<tiger::trains::ai::TrainAI_*const_*,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
                              *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<tiger::trains::ai::TrainAI_*const_*,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
              ::operator*(&local_28);
    this_00 = *ppTVar2;
    in_stack_ffffffffffffff9c = TrainAI::getType(this_00);
    if (in_stack_ffffffffffffff9c == ARMOR) {
      std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
      push_back(this_01,(value_type *)in_RDI);
    }
    in_stack_ffffffffffffff98 = TrainAI::getType(this_00);
    if (in_stack_ffffffffffffff98 == PRODUCT) {
      std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
      push_back(this_01,(value_type *)in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::ai::TrainAI_*const_*,_std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>_>
    ::operator++(&local_28);
  }
  in_RDI[1]._vptr_ISubBot = local_10;
  return;
}

Assistant:

SwitchAI::SwitchAI(const world::World *world, const std::vector<TrainAI *> &trainAIList)
{
    for (TrainAI *bot : trainAIList)
    {
        if (bot->getType() == models::GoodType::ARMOR)
            armorBots.push_back(bot);

        if (bot->getType() == models::GoodType::PRODUCT)
            productBots.push_back(bot);
    }

    this->world = world;
}